

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBegin_usingCDict_advanced
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  size_t sVar7;
  ZSTD_compressionParameters ZStack_e8;
  ZSTD_CCtx_params local_c0;
  unsigned_long_long uVar6;
  
  if (cdict == (ZSTD_CDict *)0x0) {
    sVar7 = 0xffffffffffffffe0;
  }
  else {
    memcpy(&local_c0,&cctx->requestedParams,0x90);
    if (((((pledgedSrcSize < 0x20000) || (pledgedSrcSize == 0xffffffffffffffff)) ||
         (pledgedSrcSize < cdict->dictContentSize * 6)) || (cdict->compressionLevel == 0)) &&
       (local_c0.attachDictPref != ZSTD_dictForceLoad)) {
      ZStack_e8.windowLog = (cdict->matchState).cParams.windowLog;
      ZStack_e8.chainLog = (cdict->matchState).cParams.chainLog;
      uVar2 = (cdict->matchState).cParams.hashLog;
      uVar3 = (cdict->matchState).cParams.searchLog;
      uVar4 = (cdict->matchState).cParams.minMatch;
      ZStack_e8.targetLength = (cdict->matchState).cParams.targetLength;
      ZStack_e8.strategy = (cdict->matchState).cParams.strategy;
      ZStack_e8.hashLog = uVar2;
      ZStack_e8.searchLog = uVar3;
      ZStack_e8.minMatch = uVar4;
    }
    else {
      ZSTD_getCParams_internal
                (&ZStack_e8,cdict->compressionLevel,-(ulong)(pledgedSrcSize == 0) | pledgedSrcSize,
                 cdict->dictContentSize);
    }
    local_c0.cParams.minMatch = ZStack_e8.minMatch;
    local_c0.cParams.targetLength = ZStack_e8.targetLength;
    local_c0.cParams.strategy = ZStack_e8.strategy;
    local_c0.cParams.windowLog = ZStack_e8.windowLog;
    local_c0.cParams.chainLog = ZStack_e8.chainLog;
    local_c0.cParams.hashLog = ZStack_e8.hashLog;
    local_c0.cParams.searchLog = ZStack_e8.searchLog;
    if (pledgedSrcSize != 0xffffffffffffffff) {
      uVar5 = 1;
      if (1 < pledgedSrcSize) {
        uVar6 = 0x80000;
        if (pledgedSrcSize < 0x80000) {
          uVar6 = pledgedSrcSize;
        }
        uVar5 = (int)uVar6 - 1;
        if (uVar5 == 0) {
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x12c2,"U32 ZSTD_highbit32(U32)");
        }
        uVar1 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        uVar5 = (uVar1 ^ 0xffffffe0) + 0x21;
      }
      local_c0.cParams.windowLog = ZStack_e8.windowLog;
      if (uVar5 < local_c0.cParams.windowLog) {
        uVar5 = local_c0.cParams.windowLog;
      }
      local_c0.cParams.chainLog = ZStack_e8.chainLog;
      local_c0.cParams.windowLog = uVar5;
    }
    local_c0.fParams._0_8_ = fParams._0_8_;
    local_c0.fParams.noDictIDFlag = fParams.noDictIDFlag;
    sVar7 = ZSTD_compressBegin_internal
                      (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,&local_c0,
                       pledgedSrcSize,ZSTDb_not_buffered);
  }
  return sVar7;
}

Assistant:

size_t ZSTD_compressBegin_usingCDict_advanced(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_advanced");
    RETURN_ERROR_IF(cdict==NULL, dictionary_wrong);
    {   ZSTD_CCtx_params params = cctx->requestedParams;
        params.cParams = ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
                        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
                        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
                        || cdict->compressionLevel == 0 )
                      && (params.attachDictPref != ZSTD_dictForceLoad) ?
                ZSTD_getCParamsFromCDict(cdict)
              : ZSTD_getCParams(cdict->compressionLevel,
                                pledgedSrcSize,
                                cdict->dictContentSize);
        /* Increase window log to fit the entire dictionary and source if the
         * source size is known. Limit the increase to 19, which is the
         * window log for compression level 1 with the largest source size.
         */
        if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
            U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
            U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
            params.cParams.windowLog = MAX(params.cParams.windowLog, limitedSrcLog);
        }
        params.fParams = fParams;
        return ZSTD_compressBegin_internal(cctx,
                                           NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                           cdict,
                                           &params, pledgedSrcSize,
                                           ZSTDb_not_buffered);
    }
}